

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void __thiscall FFT::ComplexData::set(ComplexData *this,vector<float,_std::allocator<float>_> *data)

{
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  float *pfVar4;
  imageException *in_RSI;
  long in_RDI;
  kiss_fft_cpx *outEnd;
  kiss_fft_cpx *out;
  float *in;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffd0;
  float *pfVar5;
  float *local_28;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = std::vector<float,_std::allocator<float>_>::empty(in_stack_ffffffffffffffd0);
  if (((!bVar1) && (*(int *)(in_RDI + 0x10) != 0)) && (*(int *)(in_RDI + 0x14) != 0)) {
    sVar2 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)in_RSI);
    if (sVar2 == (uint)(*(int *)(in_RDI + 0x10) * *(int *)(in_RDI + 0x14))) {
      local_28 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x144c58);
      pfVar5 = *(float **)(in_RDI + 8);
      pfVar4 = pfVar5 + (ulong)(uint)(*(int *)(in_RDI + 0x10) * *(int *)(in_RDI + 0x14)) * 2;
      for (; pfVar5 != pfVar4; pfVar5 = pfVar5 + 2) {
        *pfVar5 = *local_28;
        pfVar5[1] = 0.0;
        local_28 = local_28 + 1;
      }
      return;
    }
  }
  uVar3 = __cxa_allocate_exception(0x28);
  imageException::imageException(in_RSI,in_stack_ffffffffffffffe8);
  __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ComplexData::set( const std::vector<float> & data )
    {
        if ( data.empty() || _width == 0 || _height == 0 || data.size() != _width * _height )
            throw imageException( "Failed to allocate complex data for empty or coloured image" );

        const float * in = data.data();
        kiss_fft_cpx * out = _data;
        const kiss_fft_cpx * outEnd = out + _width * _height;

        for ( ; out != outEnd; ++in, ++out ) {
            out->r = *in;
            out->i = 0;
        }
    }